

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recenter.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  SimInfo *info_00;
  void *pvVar2;
  undefined8 uVar3;
  int istep;
  Thermo thermo;
  StuntDouble *sd;
  Molecule *mol;
  IntegrableObjectIterator j;
  MoleculeIterator i;
  Vector3d pos;
  Vector3d COM;
  int nFrames;
  DumpWriter *writer;
  DumpReader reader;
  SimInfo *info;
  SimCreator creator;
  string outputFileName;
  string inputFileName;
  gengetopt_args_info args_info;
  undefined1 in_stack_0000f5a7;
  string *in_stack_0000f5a8;
  SimCreator *in_stack_0000f5b0;
  Vector<double,_3U> *in_stack_ffffffffffffeb78;
  DumpReader *in_stack_ffffffffffffeb80;
  errorStruct *this;
  StuntDouble *in_stack_ffffffffffffeb88;
  Molecule *in_stack_ffffffffffffeb90;
  SimInfo *in_stack_ffffffffffffeb98;
  SimInfo *in_stack_ffffffffffffeba0;
  int in_stack_ffffffffffffec0c;
  DumpReader *in_stack_ffffffffffffec10;
  string *in_stack_ffffffffffffec20;
  SimInfo *in_stack_ffffffffffffec28;
  DumpWriter *in_stack_ffffffffffffec30;
  int local_139c;
  Thermo local_1398;
  SimInfo *local_1390;
  Molecule *local_1388;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_1380;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_1378 [7];
  int local_133c;
  void *local_1338;
  string *in_stack_ffffffffffffedd0;
  SimInfo *in_stack_ffffffffffffedd8;
  DumpReader *in_stack_ffffffffffffede0;
  string local_98 [32];
  string local_78 [48];
  char *local_48;
  undefined8 *local_20;
  int local_18;
  int local_4;
  
  local_4 = 0;
  OpenMD::registerLattice();
  std::__cxx11::string::string(local_78);
  std::__cxx11::string::string(local_98);
  iVar1 = cmdline_parser((int)((ulong)in_stack_ffffffffffffeb80 >> 0x20),
                         (char **)in_stack_ffffffffffffeb78,(gengetopt_args_info *)0x13261c);
  if (iVar1 != 0) {
    exit(1);
  }
  if (local_18 == 0) {
    snprintf(painCave.errMsg,2000,"No input file name was specified on the command line");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  else {
    std::__cxx11::string::operator=(local_78,(char *)*local_20);
  }
  OpenMD::SimCreator::SimCreator((SimCreator *)0x1326cd);
  info_00 = OpenMD::SimCreator::createSim
                      (in_stack_0000f5b0,in_stack_0000f5a8,(bool)in_stack_0000f5a7);
  OpenMD::DumpReader::DumpReader
            (in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
  std::__cxx11::string::operator=(local_98,local_48);
  iVar1 = std::__cxx11::string::compare(local_98);
  if (iVar1 == 0) {
    snprintf(painCave.errMsg,2000,"Input and Output File names should be different!");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  pvVar2 = operator_new(0x60);
  OpenMD::DumpWriter::DumpWriter
            (in_stack_ffffffffffffec30,in_stack_ffffffffffffec28,in_stack_ffffffffffffec20);
  local_1338 = pvVar2;
  if (pvVar2 == (void *)0x0) {
    snprintf(painCave.errMsg,2000,"error in creating DumpWriter");
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  local_133c = OpenMD::DumpReader::getNFrames(in_stack_ffffffffffffeb80);
  OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x13289b);
  OpenMD::Vector3<double>::Vector3((Vector3<double> *)0x1328aa);
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(local_1378);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_1380);
  OpenMD::Thermo::Thermo(&local_1398,info_00);
  for (local_139c = 0; local_139c < local_133c; local_139c = local_139c + 1) {
    OpenMD::DumpReader::readFrame(in_stack_ffffffffffffec10,in_stack_ffffffffffffec0c);
    OpenMD::Thermo::getCom((Thermo *)in_stack_ffffffffffffec28);
    OpenMD::Vector3<double>::operator=
              ((Vector3<double> *)in_stack_ffffffffffffeb80,
               (Vector3<double> *)in_stack_ffffffffffffeb78);
    local_1388 = OpenMD::SimInfo::beginMolecule
                           (in_stack_ffffffffffffeba0,(MoleculeIterator *)in_stack_ffffffffffffeb98)
    ;
    while (local_1388 != (Molecule *)0x0) {
      local_1390 = (SimInfo *)
                   OpenMD::Molecule::beginIntegrableObject
                             ((Molecule *)in_stack_ffffffffffffeba0,
                              (iterator *)in_stack_ffffffffffffeb98);
      while (local_1390 != (SimInfo *)0x0) {
        OpenMD::StuntDouble::getPos(in_stack_ffffffffffffeb88);
        OpenMD::Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_ffffffffffffeb80,
                   (Vector3<double> *)in_stack_ffffffffffffeb78);
        in_stack_ffffffffffffeba0 = local_1390;
        OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffeb88,
                          (Vector<double,_3U> *)in_stack_ffffffffffffeb80);
        OpenMD::Vector3<double>::Vector3
                  ((Vector3<double> *)in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
        OpenMD::StuntDouble::setPos
                  ((StuntDouble *)in_stack_ffffffffffffeb90,(Vector3d *)in_stack_ffffffffffffeb88);
        in_stack_ffffffffffffeb98 =
             (SimInfo *)
             OpenMD::Molecule::nextIntegrableObject
                       ((Molecule *)in_stack_ffffffffffffeba0,(iterator *)in_stack_ffffffffffffeb98)
        ;
        local_1390 = in_stack_ffffffffffffeb98;
      }
      in_stack_ffffffffffffeb90 =
           OpenMD::SimInfo::nextMolecule
                     (in_stack_ffffffffffffeba0,(MoleculeIterator *)in_stack_ffffffffffffeb98);
      local_1388 = in_stack_ffffffffffffeb90;
    }
    OpenMD::DumpWriter::writeDump((DumpWriter *)0x132aa2);
  }
  if (local_1338 != (void *)0x0) {
    pvVar2 = local_1338;
    OpenMD::DumpWriter::~DumpWriter((DumpWriter *)in_stack_ffffffffffffeb80);
    operator_delete(pvVar2,0x60);
  }
  uVar3 = std::__cxx11::string::c_str();
  this = &painCave;
  snprintf(painCave.errMsg,2000,"A new OpenMD file called \"%s\" has been generated.\n",uVar3);
  *(int *)(((DumpReader *)this)->buffer + 0x57e) = 3;
  *(int *)(((DumpReader *)this)->buffer + 0x57a) = 0;
  simError();
  local_4 = 0;
  OpenMD::DumpReader::~DumpReader((DumpReader *)this);
  OpenMD::SimCreator::~SimCreator((SimCreator *)0x132b5c);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_78);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  registerLattice();

  gengetopt_args_info args_info;

  std::string inputFileName;
  std::string outputFileName;

  // parse command line arguments
  if (cmdline_parser(argc, argv, &args_info) != 0) exit(1);

  // get input file name
  if (args_info.inputs_num)
    inputFileName = args_info.inputs[0];
  else {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "No input file name was specified "
             "on the command line");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  // parse md file and set up the system
  SimCreator creator;
  SimInfo* info = creator.createSim(inputFileName, false);
  DumpReader reader(info, inputFileName);

  outputFileName = args_info.output_arg;

  if (!outputFileName.compare(inputFileName)) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Input and Output File names should be different!");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  DumpWriter* writer = new DumpWriter(info, outputFileName);

  if (writer == NULL) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "error in creating DumpWriter");
    painCave.severity = OPENMD_ERROR;
    painCave.isFatal  = 1;
    simError();
  }

  int nFrames = reader.getNFrames();
  Vector3d COM;
  Vector3d pos;
  SimInfo::MoleculeIterator i;
  Molecule::IntegrableObjectIterator j;
  Molecule* mol;
  StuntDouble* sd;
  Thermo thermo(info);

  for (int istep = 0; istep < nFrames; istep++) {
    reader.readFrame(istep);
    COM = thermo.getCom();
    for (mol = info->beginMolecule(i); mol != NULL;
         mol = info->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        pos = sd->getPos();
        sd->setPos(pos - COM);
      }
    }
    writer->writeDump();
  }

  // deleting the writer will put the closing at the end of the dump file.

  delete writer;

  snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
           "A new OpenMD file called \"%s\" has been generated.\n",
           outputFileName.c_str());
  painCave.severity = OPENMD_INFO;
  painCave.isFatal  = 0;
  simError();

  return 0;
}